

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.cpp
# Opt level: O1

void * MS580314BAThread(void *pParam)

{
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  double dVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  double *pdVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double pressure;
  CHRONO chrono_filter;
  CHRONO chrono_period;
  char szTemp [256];
  MS580314BA ms580314ba;
  char szSaveFilePath [256];
  interval local_8f0;
  double local_8d8;
  int local_8d0;
  int local_8cc;
  timespec local_8c8;
  double local_8b8;
  double dStack_8b0;
  double local_8a8;
  double dStack_8a0;
  timespec local_898;
  int local_888;
  timespec local_880;
  double local_870;
  double dStack_868;
  double local_860;
  double dStack_858;
  timespec local_850;
  int local_840;
  undefined1 local_838 [16];
  timeval local_828;
  double local_818;
  double local_810;
  interval local_808;
  interval local_7f0;
  char local_7d8 [264];
  MS580314BA local_6d0;
  char local_138 [264];
  
  local_8d8 = 0.0;
  memset(&local_6d0,0,0x598);
  iVar4 = clock_getres(4,&local_898);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_8c8), iVar4 == 0)) {
    local_888 = 0;
    local_8b8 = 0.0;
    dStack_8b0 = 0.0;
    local_8a8 = 0.0;
    dStack_8a0 = 0.0;
  }
  iVar4 = clock_getres(4,&local_850);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_880), iVar4 == 0)) {
    local_840 = 0;
    local_870 = 0.0;
    dStack_868 = 0.0;
    local_860 = 0.0;
    dStack_858 = 0.0;
  }
  iVar4 = 100;
  local_838 = ZEXT816(0);
  bVar2 = false;
  local_8d0 = 0;
  do {
    local_8cc = iVar4;
    while( true ) {
      if (local_840 == 0) {
        clock_gettime(4,(timespec *)&local_8f0);
        local_870 = local_8f0.inf;
        dStack_868 = local_8f0.sup;
        local_8f0.inf =
             (double)(((long)local_8f0.inf + (long)local_860 +
                      ((long)local_8f0.sup + (long)dStack_858) / 1000000000) - local_880.tv_sec);
        local_8f0.sup =
             (double)(((long)local_8f0.sup + (long)dStack_858) % 1000000000 - local_880.tv_nsec);
        if ((long)local_8f0.sup < 0) {
          local_8f0.inf = (double)((long)local_8f0.inf + (long)local_8f0.sup / 1000000000 + -1);
          local_8f0.sup = (double)((long)local_8f0.sup % 1000000000 + 1000000000);
        }
        local_860 = local_8f0.inf;
        dStack_858 = local_8f0.sup;
      }
      iVar5 = clock_getres(4,&local_850);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_880), iVar5 == 0)) {
        local_840 = 0;
        local_860 = 0.0;
        dStack_858 = 0.0;
        local_870 = 0.0;
        dStack_868 = 0.0;
      }
      local_8f0.inf = (double)((long)iVar4 / 1000);
      local_8f0.sup = (double)(((long)iVar4 % 1000) * 1000000);
      nanosleep((timespec *)&local_8f0,(timespec *)0x0);
      iVar5 = local_8cc;
      if (bPauseMS580314BA == 0) break;
      if (bVar2) {
        puts("MS580314BA Paused.");
        iVar5 = CloseRS232Port(&local_6d0.RS232Port);
        pcVar15 = "MS580314BA disconnection failed.";
        if (iVar5 == 0) {
          pcVar15 = "MS580314BA disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit != 0) {
        bVar3 = true;
        goto LAB_001bcca0;
      }
      local_8f0.inf = 0.0;
      local_8f0.sup = 4.94065645841247e-316;
      bVar2 = false;
      nanosleep((timespec *)&local_8f0,(timespec *)0x0);
    }
    if (bRestartMS580314BA != 0) {
      if (bVar2) {
        puts("Restarting a MS580314BA.");
        iVar4 = CloseRS232Port(&local_6d0.RS232Port);
        pcVar15 = "MS580314BA disconnection failed.";
        if (iVar4 == 0) {
          pcVar15 = "MS580314BA disconnected.";
        }
        puts(pcVar15);
      }
      bRestartMS580314BA = 0;
      bVar2 = false;
    }
    iVar4 = iVar5;
    if (bVar2) {
      iVar6 = GetPressureMS580314BA(&local_6d0,&local_8d8);
      if (iVar6 == 0) {
        iVar5 = gettimeofday(&local_828,(__timezone_ptr_t)0x0);
        if (iVar5 != 0) {
          local_828.tv_sec = 0;
          local_828.tv_usec = 0;
        }
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        pressure_mes = local_8d8;
        if (local_888 == 0) {
          clock_gettime(4,(timespec *)&local_8f0);
          local_8f0.inf =
               (double)(((long)local_8f0.inf + (long)local_8a8 +
                        ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000) - local_8c8.tv_sec);
          local_8f0.sup =
               (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec);
          if ((long)local_8f0.sup < 0) {
            local_8f0.inf = (double)((long)local_8f0.inf + (long)local_8f0.sup / 1000000000 + -1);
            local_8f0.sup = (double)((long)local_8f0.sup % 1000000000 + 1000000000);
          }
          pdVar12 = &local_8f0.sup;
          dVar8 = local_8f0.inf;
        }
        else {
          pdVar12 = &dStack_8a0;
          dVar8 = local_8a8;
        }
        if (2.0 < (double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8) {
          if (local_888 == 0) {
            clock_gettime(4,(timespec *)&local_8f0);
            local_8f0.inf =
                 (double)(((long)local_8f0.inf + (long)local_8a8 +
                          ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000) - local_8c8.tv_sec)
            ;
            local_8f0.sup =
                 (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec)
            ;
            if ((long)local_8f0.sup < 0) {
              local_8f0.inf = (double)((long)local_8f0.inf + (long)local_8f0.sup / 1000000000 + -1);
              local_8f0.sup = (double)((long)local_8f0.sup % 1000000000 + 1000000000);
            }
            pdVar12 = &local_8f0.sup;
            dVar8 = local_8f0.inf;
          }
          else {
            pdVar12 = &dStack_8a0;
            dVar8 = local_8a8;
          }
          if ((double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8 <= 3.0) {
            local_838._8_8_ = 0;
            local_838._0_8_ = local_8d8;
          }
        }
        if (local_888 == 0) {
          clock_gettime(4,(timespec *)&local_8f0);
          local_8f0.inf =
               (double)(((long)local_8f0.inf + (long)local_8a8 +
                        ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000) - local_8c8.tv_sec);
          local_8f0.sup =
               (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec);
          if ((long)local_8f0.sup < 0) {
            local_8f0.inf = (double)((long)local_8f0.inf + (long)local_8f0.sup / 1000000000 + -1);
            local_8f0.sup = (double)((long)local_8f0.sup % 1000000000 + 1000000000);
          }
          pdVar12 = &local_8f0.sup;
          dVar8 = local_8f0.inf;
        }
        else {
          pdVar12 = &dStack_8a0;
          dVar8 = local_8a8;
        }
        dVar17 = local_8d8;
        if (3.0 < (double)(long)*pdVar12 / 1000000000.0 + (double)(long)dVar8) {
          uVar16 = -(ulong)(ABS(local_8d8 - local_838._0_8_) < 0.05);
          auVar18._0_8_ = (ulong)local_8d8 & uVar16;
          auVar18._8_8_ = 0;
          auVar1._8_4_ = local_838._8_4_;
          auVar1._0_8_ = ~uVar16 & (ulong)local_838._0_8_;
          auVar1._12_4_ = local_838._12_4_;
          local_838 = auVar18 | auVar1;
          dVar17 = local_838._0_8_;
        }
        local_810 = ((dVar17 - local_6d0.PressureRef) * -100000.0) /
                    (local_6d0.WaterDensity * 9.80665);
        interval::interval(&local_7f0,&local_810);
        local_818 = -z_pressure_acc;
        interval::interval(&local_808,&local_818,&z_pressure_acc);
        operator+(&local_7f0,&local_808);
        interval::operator=((interval *)&z_pressure,&local_8f0);
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        if (local_6d0.bSaveRawData != 0) {
          fprintf((FILE *)local_6d0.pfSaveFile,"%d;%d;%f;\n",local_8d8,local_828.tv_sec & 0xffffffff
                  ,local_828.tv_usec & 0xffffffff);
LAB_001bcc45:
          fflush((FILE *)local_6d0.pfSaveFile);
        }
        bVar2 = true;
        bVar3 = false;
      }
      else {
        puts("Connection to a MS580314BA lost.");
        iVar4 = CloseRS232Port(&local_6d0.RS232Port);
        if (iVar4 == 0) {
          pcVar15 = "MS580314BA disconnected.";
        }
        else {
          pcVar15 = "MS580314BA disconnection failed.";
        }
        puts(pcVar15);
LAB_001bc5f1:
        bVar2 = false;
        bVar3 = true;
        iVar4 = iVar5;
      }
    }
    else {
      iVar6 = ConnectMS580314BA(&local_6d0,"MS580314BA0.txt");
      iVar4 = local_6d0.threadperiod;
      if (iVar6 != 0) {
        local_8f0.inf = 4.94065645841247e-324;
        local_8f0.sup = 0.0;
        nanosleep((timespec *)&local_8f0,(timespec *)0x0);
        goto LAB_001bc5f1;
      }
      if (local_888 == 0) {
        clock_gettime(4,(timespec *)&local_8f0);
        local_8b8 = local_8f0.inf;
        dStack_8b0 = local_8f0.sup;
        local_8f0.inf =
             (double)(((long)local_8f0.inf + (long)local_8a8 +
                      ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000) - local_8c8.tv_sec);
        local_8f0.sup =
             (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec);
        if ((long)local_8f0.sup < 0) {
          local_8f0.inf = (double)((long)local_8f0.inf + (long)local_8f0.sup / 1000000000 + -1);
          local_8f0.sup = (double)((long)local_8f0.sup % 1000000000 + 1000000000);
        }
        local_8a8 = local_8f0.inf;
        dStack_8a0 = local_8f0.sup;
      }
      iVar5 = clock_getres(4,&local_898);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_8c8), iVar5 == 0)) {
        local_888 = 0;
        local_8a8 = 0.0;
        dStack_8a0 = 0.0;
        local_8b8 = 0.0;
        dStack_8b0 = 0.0;
      }
      if ((FILE *)local_6d0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_6d0.pfSaveFile);
        local_6d0.pfSaveFile = (FILE *)0x0;
      }
      bVar3 = false;
      bVar2 = true;
      if ((local_6d0.bSaveRawData != 0) &&
         (bVar3 = false, (FILE *)local_6d0.pfSaveFile == (FILE *)0x0)) {
        if (local_6d0.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_7d8,"ms580314ba",0xb);
        }
        else {
          sprintf(local_7d8,"%.127s",local_6d0.szCfgFilePath);
        }
        sVar9 = strlen(local_7d8);
        uVar7 = (uint)sVar9;
        uVar14 = sVar9 & 0xffffffff;
        uVar10 = (int)uVar7 >> 0x1f & uVar7;
        uVar16 = sVar9 & 0xffffffff;
        do {
          uVar14 = uVar14 - 1;
          uVar13 = (uint)uVar16;
          uVar16 = (ulong)(uVar10 - 1);
          uVar11 = uVar10;
          if ((int)uVar13 < 1) break;
          uVar16 = (ulong)(uVar13 - 1);
          uVar11 = uVar13;
        } while (local_7d8[uVar14 & 0xffffffff] != '.');
        if ((int)uVar11 <= (int)uVar7 && 1 < (int)uVar11) {
          memset(local_7d8 + uVar16,0,sVar9 - uVar16);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar15 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.csv",local_7d8,pcVar15);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_6d0.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_6d0.pfSaveFile != (FILE *)0x0) {
          fwrite("tv_sec;tv_usec;pressure;\n",0x19,1,(FILE *)local_6d0.pfSaveFile);
          goto LAB_001bcc45;
        }
        puts("Unable to create MS580314BA data file.");
        bVar3 = false;
        goto LAB_001bcca0;
      }
    }
    if ((bVar3) &&
       (local_8d0 = local_8d0 + 1, ExitOnErrorCount <= local_8d0 && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001bcca0:
      if (local_840 == 0) {
        clock_gettime(4,(timespec *)&local_8f0);
        local_870 = local_8f0.inf;
        dStack_868 = local_8f0.sup;
        local_8f0.inf =
             (double)(((long)local_8f0.inf + (long)local_860 +
                      ((long)local_8f0.sup + (long)dStack_858) / 1000000000) - local_880.tv_sec);
        local_8f0.sup =
             (double)(((long)local_8f0.sup + (long)dStack_858) % 1000000000 - local_880.tv_nsec);
        if ((long)local_8f0.sup < 0) {
          local_8f0.inf = (double)((long)local_8f0.inf + (long)local_8f0.sup / 1000000000 + -1);
          local_8f0.sup = (double)((long)local_8f0.sup % 1000000000 + 1000000000);
        }
        local_860 = local_8f0.inf;
        dStack_858 = local_8f0.sup;
      }
      if (local_888 == 0) {
        clock_gettime(4,(timespec *)&local_8f0);
        local_8b8 = local_8f0.inf;
        dStack_8b0 = local_8f0.sup;
        local_8f0.inf =
             (double)(((long)local_8f0.inf + (long)local_8a8 +
                      ((long)local_8f0.sup + (long)dStack_8a0) / 1000000000) - local_8c8.tv_sec);
        local_8f0.sup =
             (double)(((long)local_8f0.sup + (long)dStack_8a0) % 1000000000 - local_8c8.tv_nsec);
        if ((long)local_8f0.sup < 0) {
          local_8f0.inf = (double)((long)local_8f0.inf + (long)local_8f0.sup / 1000000000 + -1);
          local_8f0.sup = (double)((long)local_8f0.sup % 1000000000 + 1000000000);
        }
        local_8a8 = local_8f0.inf;
        dStack_8a0 = local_8f0.sup;
      }
      if ((FILE *)local_6d0.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_6d0.pfSaveFile);
        local_6d0.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar3) {
        iVar4 = CloseRS232Port(&local_6d0.RS232Port);
        pcVar15 = "MS580314BA disconnection failed.";
        if (iVar4 == 0) {
          pcVar15 = "MS580314BA disconnected.";
        }
        puts(pcVar15);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE MS580314BAThread(void* pParam)
{
	MS580314BA ms580314ba;
	struct timeval tv;
	double pressure = 0, pressure_prev = 0, filteredpressure = 0;
	CHRONO chrono_filter;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ms580314ba, 0, sizeof(MS580314BA));

	StartChrono(&chrono_filter);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMS580314BA)
		{
			if (bConnected)
			{
				printf("MS580314BA Paused.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMS580314BA)
		{
			if (bConnected)
			{
				printf("Restarting a MS580314BA.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}
			bRestartMS580314BA = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMS580314BA(&ms580314ba, "MS580314BA0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ms580314ba.threadperiod;

				StopChronoQuick(&chrono_filter);
				StartChrono(&chrono_filter);

				if (ms580314ba.pfSaveFile != NULL)
				{
					fclose(ms580314ba.pfSaveFile); 
					ms580314ba.pfSaveFile = NULL;
				}
				if ((ms580314ba.bSaveRawData)&&(ms580314ba.pfSaveFile == NULL)) 
				{
					if (strlen(ms580314ba.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ms580314ba.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ms580314ba");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ms580314ba.pfSaveFile = fopen(szSaveFilePath, "w");
					if (ms580314ba.pfSaveFile == NULL) 
					{
						printf("Unable to create MS580314BA data file.\n");
						break;
					}
					fprintf(ms580314ba.pfSaveFile, "tv_sec;tv_usec;pressure;\n"); 
					fflush(ms580314ba.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetPressureMS580314BA(&ms580314ba, &pressure) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = pressure;
				if ((GetTimeElapsedChronoQuick(&chrono_filter) > 2)&&(GetTimeElapsedChronoQuick(&chrono_filter) <= 3))
				{
					pressure_prev = pressure; // Initialization of pressure_prev...
				}
				if (GetTimeElapsedChronoQuick(&chrono_filter) > 3)
				{
					if (fabs(pressure-pressure_prev) < 0.05)
					{
						filteredpressure = pressure;
						pressure_prev = filteredpressure;
					}
					else
					{
						// Ignore outlier...
						filteredpressure = pressure_prev;
					}
				}
				else
				{
					filteredpressure = pressure;
				}
				z_pressure = Pressure2Height(filteredpressure, ms580314ba.PressureRef, ms580314ba.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);

				if (ms580314ba.bSaveRawData)
				{
					fprintf(ms580314ba.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, pressure);
					fflush(ms580314ba.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a MS580314BA lost.\n");
				bConnected = FALSE;
				DisconnectMS580314BA(&ms580314ba);
			}		
		}

		//printf("MS580314BAThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_filter);

	if (ms580314ba.pfSaveFile != NULL)
	{
		fclose(ms580314ba.pfSaveFile); 
		ms580314ba.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMS580314BA(&ms580314ba);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}